

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildMaybeFunction(ObjectModelBuilder *this,value *value,Class *clazz)

{
  int iVar1;
  ostream *poVar2;
  string local_48;
  
  iVar1 = value->type_;
  if (iVar1 == 3) {
    string_trim(&local_48,(value->u_).string_);
    buildFunction(this,&local_48,clazz);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: function in class=\'",0x1a);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                        (clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is not a JSON string..",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return iVar1 == 3;
}

Assistant:

bool ObjectModelBuilder::buildMaybeFunction(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: function in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildFunction(string_trim(value.get<std::string>()), clazz);
}